

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairprice.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  long *plVar4;
  runtime_error *this;
  char *pcVar5;
  int guess;
  uint local_3c;
  int local_38;
  int local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----------------",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Fair price game",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-----------------",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"The number to guess is a random one under ",0x2a);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
  plVar4 = (long *)std::ostream::operator<<(poVar3,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  local_34 = random_int();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Your guess: ",0xc);
  std::istream::operator>>((istream *)&std::cin,(int *)&local_3c);
  uVar2 = *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18));
  if ((uVar2 & 2) == 0) {
    local_38 = 1;
    do {
      if ((uVar2 & 5) == 0) {
        if (local_3c < 0x3e9) {
          pcVar5 = "More.";
          if ((local_34 <= (int)local_3c) && (pcVar5 = "Less.", (int)local_3c <= local_34)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"That\'s it! The random number was ",0x21);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            poVar3 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"You win in ",0xb);
            iVar1 = local_38;
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," round",6);
            pcVar5 = "s.";
            if (iVar1 < 2) {
              pcVar5 = ".";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,(ulong)(1 < iVar1) + 1)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            return 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
          local_38 = local_38 + 1;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Number out of range (range: ",0x1c);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,1000);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"). Try again.",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid input. Try again!",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1060e8);
        std::istream::ignore((long)&std::cin,-1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Your guess: ",0xc);
      std::istream::operator>>((istream *)&std::cin,(int *)&local_3c);
      uVar2 = *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18));
    } while ((uVar2 & 2) == 0);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Input stream has been closed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
    std::cout 
        << "-----------------" << std::endl
        << " Fair price game" << std::endl
        << "-----------------" << std::endl
        << std::endl
        << "The number to guess is a random one under " << min << " and " << max << std::endl
        << std::endl;

    const int number = random_int();
    int round = 1;

    while (true) {
        int guess;
        std::cout << "Your guess: ";
        std::cin >> guess;

        if (std::cin.eof()) {
            throw std::runtime_error("Input stream has been closed!");
        } else
        if (std::cin.fail()) {
            std::cout << "Invalid input. Try again!" << std::endl;
            std::cin.clear();
            std::cin.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        } else {
            if (guess < min || guess > max) {
                std::cout << "Number out of range (range: " << min << "-" << max << "). Try again." << std::endl;
            } else {
                if (guess < number) {
                    std::cout << "More." << std::endl;
                } else
                if (guess > number) {
                    std::cout << "Less." << std::endl;
                } else {
                    std::cout << "That's it! The random number was " << number << "." << std::endl
                        << "You win in " << round << " round" << ((round > 1) ? "s." : ".") << std::endl;
                    break;
                }
                ++round;
            }
        }
    }
    return EXIT_SUCCESS;
}